

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O2

void __thiscall
QPicturePaintEngine::updateBackground(QPicturePaintEngine *this,BGMode bgMode,QBrush *bgBrush)

{
  int *piVar1;
  QPaintEnginePrivate *stream;
  QPaintEnginePrivate *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QPaintEngine).d_ptr.d;
  piVar1 = (int *)(*(long *)&pQVar2[1].systemRect + 0x18);
  *piVar1 = *piVar1 + 1;
  stream = pQVar2 + 1;
  QDataStream::operator<<((QDataStream *)stream,0x28);
  QDataStream::operator<<((QDataStream *)stream,0);
  iVar3 = QBuffer::pos();
  ::operator<<((QDataStream *)stream,
               &((bgBrush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                 super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                 super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
  local_58.w = 0.0;
  local_58.h = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  writeCmdLength(this,iVar3,&local_58,false);
  piVar1 = (int *)(*(long *)&pQVar2[1].systemRect + 0x18);
  *piVar1 = *piVar1 + 1;
  QDataStream::operator<<((QDataStream *)stream,0x29);
  QDataStream::operator<<((QDataStream *)stream,0);
  iVar3 = QBuffer::pos();
  QDataStream::operator<<((QDataStream *)stream,(int)(char)bgMode);
  local_58.w = 0.0;
  local_58.h = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  writeCmdLength(this,iVar3,&local_58,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateBackground(Qt::BGMode bgMode, const QBrush &bgBrush)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateBackground(): mode:" << bgMode << "style:" << bgBrush.style();
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetBkColor);
    d->s << bgBrush.color();
    writeCmdLength(pos, QRect(), false);

    SERIALIZE_CMD(QPicturePrivate::PdcSetBkMode);
    d->s << (qint8) bgMode;
    writeCmdLength(pos, QRectF(), false);
}